

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesBodySharedMass::ArchiveIN(ChVariablesBodySharedMass *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecificPtr<chrono::ChSharedMassBody> specFuncA;
  undefined **local_38;
  ChSharedMassBody **local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChVariablesBodySharedMass>(marchive);
  local_30 = &this->sharedmass;
  local_38 = &PTR__ChFunctorArchiveIn_00b638d8;
  local_28 = "sharedmass";
  local_18 = 0;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x68))(marchive);
  return;
}

Assistant:

void ChVariablesBodySharedMass::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVariablesBodySharedMass>();
    // deserialize parent class
    ChVariablesBody::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(sharedmass);
}